

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O0

bool __thiscall MeCab::Writer::writeDump(Writer *this,Lattice *lattice,StringBuffer *os)

{
  size_t in_RCX;
  StringBuffer *in_RDX;
  long *in_RSI;
  Path *path;
  Node *node;
  char *str;
  undefined7 in_stack_ffffffffffffffc8;
  char in_stack_ffffffffffffffcf;
  StringBuffer *in_stack_ffffffffffffffd0;
  long local_28;
  
  (**(code **)(*in_RSI + 0x40))();
  for (local_28 = (**(code **)(*in_RSI + 0x10))(); local_28 != 0; local_28 = *(long *)(local_28 + 8)
      ) {
    StringBuffer::operator<<(os,CONCAT22(str._6_2_,str._4_2_));
    StringBuffer::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
    if (*(char *)(local_28 + 0x4f) == '\x02') {
      StringBuffer::operator<<
                (in_stack_ffffffffffffffd0,
                 (char *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    }
    else if (*(char *)(local_28 + 0x4f) == '\x03') {
      StringBuffer::operator<<
                (in_stack_ffffffffffffffd0,
                 (char *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    }
    else {
      StringBuffer::write(in_RDX,(int)*(undefined8 *)(local_28 + 0x30),
                          (void *)(ulong)*(ushort *)(local_28 + 0x44),in_RCX);
    }
    StringBuffer::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
    StringBuffer::operator<<
              (in_stack_ffffffffffffffd0,
               (char *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    StringBuffer::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
    StringBuffer::operator<<(os,CONCAT22(str._6_2_,str._4_2_));
    StringBuffer::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
    in_RCX = (size_t)*(ushort *)(local_28 + 0x44);
    StringBuffer::operator<<(os,CONCAT22(str._6_2_,str._4_2_));
    StringBuffer::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
    StringBuffer::operator<<(os,str._6_2_);
    StringBuffer::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
    StringBuffer::operator<<(os,str._6_2_);
    StringBuffer::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
    StringBuffer::operator<<(os,str._6_2_);
    StringBuffer::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
    StringBuffer::operator<<(os,CONCAT22(str._6_2_,str._4_2_));
    StringBuffer::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
    StringBuffer::operator<<(os,CONCAT22(str._6_2_,str._4_2_));
    StringBuffer::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
    StringBuffer::operator<<(os,CONCAT22(str._6_2_,str._4_2_));
    StringBuffer::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
    StringBuffer::operator<<(os,(double)CONCAT26(str._6_2_,CONCAT24(str._4_2_,str._0_4_)));
    StringBuffer::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
    StringBuffer::operator<<(os,(double)CONCAT26(str._6_2_,CONCAT24(str._4_2_,str._0_4_)));
    StringBuffer::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
    StringBuffer::operator<<(os,(double)CONCAT26(str._6_2_,CONCAT24(str._4_2_,str._0_4_)));
    StringBuffer::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
    StringBuffer::operator<<(os,CONCAT26(str._6_2_,CONCAT24(str._4_2_,str._0_4_)));
    for (in_stack_ffffffffffffffd0 = *(StringBuffer **)(local_28 + 0x28);
        in_stack_ffffffffffffffd0 != (StringBuffer *)0x0;
        in_stack_ffffffffffffffd0 = (StringBuffer *)in_stack_ffffffffffffffd0->ptr_) {
      StringBuffer::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
      StringBuffer::operator<<(os,CONCAT22(str._6_2_,str._4_2_));
      StringBuffer::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
      StringBuffer::operator<<(os,CONCAT22(str._6_2_,str._4_2_));
      StringBuffer::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
      StringBuffer::operator<<(os,(double)CONCAT26(str._6_2_,CONCAT24(str._4_2_,str._0_4_)));
    }
    StringBuffer::operator<<((StringBuffer *)0x0,in_stack_ffffffffffffffcf);
  }
  return true;
}

Assistant:

bool Writer::writeDump(Lattice *lattice, StringBuffer *os) const {
  const char *str = lattice->sentence();
  for (const Node *node = lattice->bos_node(); node; node = node->next) {
    *os << node->id << ' ';
    if (node->stat == MECAB_BOS_NODE) {
      *os << "BOS";
    } else if (node->stat == MECAB_EOS_NODE) {
      *os << "EOS";
    } else {
      os->write(node->surface, node->length);
    }

    *os << ' ' << node->feature
        << ' ' << static_cast<int>(node->surface - str)
        << ' ' << static_cast<int>(node->surface - str + node->length)
        << ' ' << node->rcAttr
        << ' ' << node->lcAttr
        << ' ' << node->posid
        << ' ' << static_cast<int>(node->char_type)
        << ' ' << static_cast<int>(node->stat)
        << ' ' << static_cast<int>(node->isbest)
        << ' ' << node->alpha
        << ' ' << node->beta
        << ' ' << node->prob
        << ' ' << node->cost;

    for (const Path *path = node->lpath; path; path = path->lnext) {
      *os << ' ' << path->lnode->id << ':' << path->cost << ':' << path->prob;
    }
    *os << '\n';
  }
  return true;
}